

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O2

void __thiscall Math_ErfInv_Test::Math_ErfInv_Test(Math_ErfInv_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0313d410;
  return;
}

Assistant:

TEST(Math, ErfInv) {
    float xvl[] = {0., 0.1125, 0.25, .753, 1.521, 2.5115};
    for (float x : xvl) {
        Float e = std::erf(x);
        if (e < 1) {
            Float ei = ErfInv(e);
            if (x == 0)
                EXPECT_EQ(0, ei);
            else {
                Float err = std::abs(ei - x) / x;
                EXPECT_LT(err, 1e-4) << x << " erf " << e << " inv " << ei;
            }
        }
    }
}